

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

Expression ** __thiscall
wasm::DataFlowOpts::getIndexPointer(DataFlowOpts *this,Expression *expr,Index index)

{
  Unary *pUVar1;
  Binary *pBVar2;
  Select *pSVar3;
  Select *select;
  Binary *binary;
  Unary *unary;
  Index index_local;
  Expression *expr_local;
  DataFlowOpts *this_local;
  
  pUVar1 = Expression::dynCast<wasm::Unary>(expr);
  if (pUVar1 == (Unary *)0x0) {
    pBVar2 = Expression::dynCast<wasm::Binary>(expr);
    if (pBVar2 == (Binary *)0x0) {
      pSVar3 = Expression::dynCast<wasm::Select>(expr);
      if (pSVar3 == (Select *)0x0) {
        handle_unreachable("unexpected expression type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                           ,0xfb);
      }
      if (index == 0) {
        this_local = (DataFlowOpts *)&pSVar3->condition;
      }
      else if (index == 1) {
        this_local = (DataFlowOpts *)&pSVar3->ifTrue;
      }
      else {
        if (index != 2) {
          handle_unreachable("unexpected index",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                             ,0xf9);
        }
        this_local = (DataFlowOpts *)&pSVar3->ifFalse;
      }
    }
    else if (index == 0) {
      this_local = (DataFlowOpts *)&pBVar2->left;
    }
    else {
      if (index != 1) {
        handle_unreachable("unexpected index",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                           ,0xf0);
      }
      this_local = (DataFlowOpts *)&pBVar2->right;
    }
  }
  else {
    if (index != 0) {
      __assert_fail("index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                    ,0xe8,"Expression **wasm::DataFlowOpts::getIndexPointer(Expression *, Index)");
    }
    this_local = (DataFlowOpts *)&pUVar1->value;
  }
  return (Expression **)this_local;
}

Assistant:

Expression** getIndexPointer(Expression* expr, Index index) {
    if (auto* unary = expr->dynCast<Unary>()) {
      assert(index == 0);
      return &unary->value;
    } else if (auto* binary = expr->dynCast<Binary>()) {
      if (index == 0) {
        return &binary->left;
      } else if (index == 1) {
        return &binary->right;
      }
      WASM_UNREACHABLE("unexpected index");
    } else if (auto* select = expr->dynCast<Select>()) {
      if (index == 0) {
        return &select->condition;
      } else if (index == 1) {
        return &select->ifTrue;
      } else if (index == 2) {
        return &select->ifFalse;
      }
      WASM_UNREACHABLE("unexpected index");
    }
    WASM_UNREACHABLE("unexpected expression type");
  }